

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O2

void __thiscall test::spi_test::SPITest::FatalFailure2_Sub(SPITest *this,int *count)

{
  char **substr;
  int *expected;
  int *expected_00;
  int *expected_01;
  TestObjectX *expected_02;
  string *val1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ScopedSPITestFlag SVar2;
  TestFlag *pTVar3;
  iuCodeMessage *val1_00;
  int val1_01;
  int *in_R9;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2;
  char (*actual) [2];
  int *actual_00;
  longdouble val1_02;
  float val1_03;
  double val1_04;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  iuCodeMessage local_240;
  ScopedSPITestFlag guard_2;
  undefined4 uStack_20c;
  _Variadic_union<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0 [12];
  ScopedSPITestFlag guard_29;
  ScopedSPITestFlag guard;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_allocated_capacity._0_4_ =
       iutest_ar.m_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  iutest_ar._32_4_ = iutest_ar._32_4_ & 0xffffff00;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  memset(local_1f0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            ((string *)&guard_2,(internal *)&iutest_ar,(AssertionResult *)"false","false","true",
             (char *)in_R9);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
             ,0x1e,(char *)CONCAT44(uStack_20c,guard_2.super_ScopedGuard.m_test_flags));
  local_240._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&guard_2);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x1e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_allocated_capacity._0_4_ =
       iutest_ar.m_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  iutest_ar._32_4_ = iutest_ar._32_4_ & 0xffffff00;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  memset(local_1f0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            ((string *)&guard_2,(internal *)&iutest_ar,(AssertionResult *)"true","true","false",
             (char *)in_R9);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
             ,0x1f,(char *)CONCAT44(uStack_20c,guard_2.super_ScopedGuard.m_test_flags));
  local_240._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&guard_2);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x1f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::NullHelper<false>::CompareEq<void>
            ((char *)iutest_failure_checker.
                     super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                     _vptr_ReporterHolder,
             (void *)CONCAT44(iutest_failure_checker.
                              super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface._4_4_,
                              (int)iutest_failure_checker.
                                   super_Collector<iutest::detail::NoTestPartResultReporter>.
                                   super_NoTestPartResultReporter.
                                   super_TestPartResultReporterInterface.
                                   _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x20,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x20,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::NullHelper<false>::CompareNe<void>
            (&iutest_ar,"(reinterpret_cast<void*>(0))",(void *)0x0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x21,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x21,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSame<int,int>
            (&iutest_ar,(internal *)0x31d74e,"b",(char *)&this->a,&this->b,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x22,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x22,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  expected_02 = &this->ox;
  iutest::internal::CmpHelperMemCmpEQ<test::spi_test::TestObjectX>
            (&iutest_ar,"ox","oy",expected_02,&this->oy);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x24,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x24,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperMemCmpNE<test::spi_test::TestObjectX>
            (&iutest_ar,"ox","ox",expected_02,expected_02);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x25,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x25,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = (ulong)(uint)local_1f0[0]._4_4_ << 0x20;
  local_240.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x3149ec,"1",(char *)local_1f0,(int *)&local_240,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x27,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x27,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_240.m_message._M_dataplus._M_p._0_4_ = 1;
  local_1f0[0]._0_4_ = 1;
  iutest::internal::CmpHelperNE<int,int>
            (&iutest_ar,(internal *)0x31e18d,"1",(char *)local_1f0,(int *)&local_240,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x28,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x28,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_4_ = 1;
  local_240.m_message._M_dataplus._M_p._0_4_ = 0;
  iutest::internal::CmpHelperLE<int,int>
            (&iutest_ar,(internal *)0x31e18d,"0",(char *)local_1f0,(int *)&local_240,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x29,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x29,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_4_ = 1;
  local_240.m_message._M_dataplus._M_p._0_4_ = 0;
  iutest::internal::CmpHelperLT<int,int>
            (&iutest_ar,(internal *)0x31e18d,"0",(char *)local_1f0,(int *)&local_240,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2a,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = local_1f0[0]._0_8_ & 0xffffffff00000000;
  local_240.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::internal::CmpHelperGE<int,int>
            (&iutest_ar,(internal *)0x3149ec,"1",(char *)local_1f0,(int *)&local_240,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2b,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2b,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = local_1f0[0]._0_8_ & 0xffffffff00000000;
  val1_00 = &local_240;
  local_240.m_message._M_dataplus._M_p._0_4_ = 1;
  iutest::internal::CmpHelperGT<int,int>
            (&iutest_ar,(internal *)0x3149ec,"1",(char *)local_1f0,(int *)val1_00,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2c,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperFloatingPointEQ<float>(&iutest_ar,"0","1",0.0,1.0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperFloatingPointEQ<double>(&iutest_ar,"0","1",0.0,1.0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2f,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x2f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  val1_03 = 0.0 / this->fa;
  iutest::internal::CmpHelperFloatingPointEQ<float>
            (&iutest_ar,"Div(0.0f, fa)","Div(0.0f, fa)",val1_03,val1_03);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x30,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x30,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  val1_04 = 0.0 / this->da;
  iutest::internal::CmpHelperFloatingPointEQ<double>
            (&iutest_ar,"Div(0.0, da)","Div(0.0, da)",val1_04,val1_04);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x31,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x31,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperFloatingPointLE<float>(&iutest_ar,"2","0",2.0,0.0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x32,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x32,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperFloatingPointLE<double>(&iutest_ar,"2","0",2.0,0.0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x33,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x33,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperFloatingPointEQ<long_double>
            (&iutest_ar,"0","1",(longdouble)0,(longdouble)1);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3d,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  val1_02 = (longdouble)0 / this->lda;
  iutest::internal::CmpHelperFloatingPointEQ<long_double>
            (&iutest_ar,"Div(0.0l, lda)","Div(0.0l, lda)",val1_02,val1_02);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(0x",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x3e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = 0x3f8000003f800000;
  iutest::internal::CmpHelperFloatingPointComplexEQ<float,float>
            (&iutest_ar,(internal *)"::std::complex<float>(1.0f, 1.0f)","1.0f",(char *)local_1f0,
             (complex<float> *)val1_00,1.0);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x41,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x41,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0xcc1f;
  uVar6 = 0x29;
  uVar7 = 0;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = local_1f0[0]._0_8_ & 0xffffffff00000000;
  local_240.m_message._M_dataplus._M_p._0_4_ = 100;
  guard.super_ScopedGuard.m_test_flags = (ScopedGuard)2;
  iutest::internal::CmpHelperNear<int,int>
            (&iutest_ar,(internal *)0x3149ec,"100","2",(char *)local_1f0,(int *)&local_240,
             (int *)&guard,(int *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x42,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x42,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)0x31d6bb,"\"a\"","A","a",
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x44,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x44,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)0x31d6bb,"null_str","A",this->null_str,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x45,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x45,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  substr = &this->null_str;
  pcVar4 = (char *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)"null_str","\"a\"",*substr,"a",
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x46,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x46,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTREQ<char_const*>
            (&iutest_ar,(internal *)"__null","\"a\"",(char *)0x0,"a",pcVar4);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x47,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(null)",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x47,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  val1 = &this->sa;
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,char_const*>
            (&iutest_ar,(internal *)"sa","\"A\"",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x313884,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x48,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x48,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)0x31d6bb,"sa","A",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x49,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x49,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_29);
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  std::__cxx11::string::string((string *)&guard,(string *)&this->sb);
  iutest::internal::CmpHelperSTREQ<std::__cxx11::string,std::__cxx11::string>
            (&iutest_ar,(internal *)"sa","sb",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guard,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4a,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_29;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTREQ<wchar_t_const*,wchar_t_const*>
            (&iutest_ar,(internal *)"L\"A\"","L\"a\"",(char *)L"A",L"a",
             (wchar_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4b,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4b,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  pcVar4 = (char *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::CmpHelperSTRNE<char_const*,char_const*>
            (&iutest_ar,(internal *)0x31d6c0,"\"a\"","a","a",
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4c,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRNE<char_const*>
            (&iutest_ar,(internal *)"__null","null_str",(char *)0x0,*substr,pcVar4);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4d,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(null)",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRNE<char_const*>
            (&iutest_ar,(internal *)"null_str","__null",*substr,(char *)0x0,pcVar4);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(null)",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRNE<char_const*,char_const*>
            (&iutest_ar,(internal *)"null_str","null_str",*substr,*substr,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4f,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"(null)",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x4f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,char_const*>
            (&iutest_ar,(internal *)"sa","\"a\"",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31d74e,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x50,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x50,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  iutest::internal::CmpHelperSTRNE<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)0x31d6c0,"sa","a",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x51,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x51,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_29);
  std::__cxx11::string::string((string *)&guard_2,(string *)val1);
  std::__cxx11::string::string((string *)&guard,(string *)val1);
  iutest::internal::CmpHelperSTRNE<std::__cxx11::string,std::__cxx11::string>
            (&iutest_ar,(internal *)"sa","sa",(char *)&guard_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guard,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  std::__cxx11::string::~string((string *)&guard);
  std::__cxx11::string::~string((string *)&guard_2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x52,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)guard_29.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x52,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  val2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &iutest_type_traits::enabler_t<void>::value;
  iutest::internal::CmpHelperSTRNE<wchar_t_const*,wchar_t_const*>
            (&iutest_ar,(internal *)"L\"a\"","L\"a\"",(char *)L"a",L"a",
             (wchar_t *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(iutest_failure_checker.
                               super_Collector<iutest::detail::NoTestPartResultReporter>.
                               super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                               _vptr_TestPartResultReporterInterface._4_4_,
                               (int)iutest_failure_checker.
                                    super_Collector<iutest::detail::NoTestPartResultReporter>.
                                    super_NoTestPartResultReporter.
                                    super_TestPartResultReporterInterface.
                                    _vptr_TestPartResultReporterInterface));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x53,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x53,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ(&iutest_ar,"\"b\"","\"a\"","b","a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x55,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x55,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ(&iutest_ar,"\"b\"","null_str","b",*substr);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x56,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x56,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ(&iutest_ar,"null_str","\"a\"",*substr,"a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x57,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x57,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)"sa","\"b\"",(char *)val1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31ddbc,
             (char *)val2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x58,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x58,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)0x31d6c5,"sa","b",(char *)val1,val2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x59,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x59,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)"sa","sb",(char *)val1,&this->sb,val2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5a,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASEEQ(&iutest_ar,"L\"a\"","L\"b\"",L"a",L"b");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5b,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5b,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE(&iutest_ar,"\"a\"","\"a\"","a","a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5c,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE(&iutest_ar,"\"A\"","\"a\"","A","a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5d,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE(&iutest_ar,"null_str","null_str",*substr,*substr);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)"sa","\"A\"",(char *)val1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x313884,
             (char *)val2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5f,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x5f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)0x31d6bb,"sa","A",(char *)val1,val2);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x60,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x60,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE<char,std::char_traits<char>,std::allocator<char>>
            (&iutest_ar,(internal *)"sa","sa",(char *)val1,val1,val2);
  val1_01 = (int)val2;
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x61,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x61,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::internal::CmpHelperSTRCASENE(&iutest_ar,"L\"A\"","L\"a\"",L"A",L"a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x62,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x62,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::AssertPred1Helper<bool(*)(int),int>
            (&iutest_ar,(iutest *)"IsOdd","2",(char *)IsOdd,(_func_bool_int *)0x2,val1_01);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,100,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,100,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0xfe63;
  uVar6 = 0x29;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::AssertPred2Helper<bool(*)(int,int),int,int>
            (&iutest_ar,(iutest *)"IsGreater","0","1",(char *)IsGreater,(_func_bool_int_int *)0x0,1,
             CONCAT22(uVar6,uVar5));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x65,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x65,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0xfff8;
  uVar6 = 0x29;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::AssertPred3Helper<bool(*)(int,int,int),int,int,int>
            (&iutest_ar,(iutest *)"PredTest3","0","1","3",(char *)PredTest3,
             (_func_bool_int_int_int *)0x0,1,3,CONCAT22(uVar6,uVar5));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x66,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x66,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x2a01d8,
             (_func_bool_int_int_int_int *)
             CONCAT44(iutest_failure_checker.
                      super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                      iutest_failure_checker.
                      super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_),
             iutest_failure_checker.m_Type,(int)iutest_ar.m_message._M_dataplus._M_p,
             (int)iutest_ar.m_message._M_string_length,
             iutest_ar.m_message.field_2._M_allocated_capacity._0_4_);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x67,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x67,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iutest::AssertPred5Helper<bool(*)(int,int,int,int,int),int,int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest5,"5",
             (char *)CONCAT44(iutest_failure_checker.
                              super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              iutest_failure_checker.
                              super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                              super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_),
             (_func_bool_int_int_int_int_int *)
             CONCAT44(iutest_failure_checker._52_4_,iutest_failure_checker.m_Type),
             (int)iutest_ar.m_message._M_dataplus._M_p,(int)iutest_ar.m_message._M_string_length,
             iutest_ar.m_message.field_2._M_allocated_capacity._0_4_,
             iutest_ar.m_message.field_2._8_4_,iutest_ar._32_4_);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x68,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x68,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  actual = (char (*) [2])0x1;
  iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
            (&iutest_ar,(iutest *)"PredTest6","0, 1, 2, 3, 4, 6",(char *)PredTest6,
             (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,6,
             (int)iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.
                  super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x6a,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"evaluates to false, where",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x6a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::StrInHelper::Assertion<char[2],char[2]>
            (&iutest_ar,(StrInHelper *)0x31d6c5,"\"a\"","b",(char (*) [2])0x31d74e,actual);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x73,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strstr",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x73,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::StrInHelper::Assertion<char[2],char_const*>
            (&iutest_ar,(StrInHelper *)0x31d6c5,"null_str","b",(char (*) [2])substr,(char **)actual)
  ;
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x74,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strstr",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x74,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::StrInHelper::Assertion<char_const*,char[2]>
            (&iutest_ar,(StrInHelper *)"null_str","\"a\"",(char *)substr,(char **)0x31d74e,actual);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x75,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strstr",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x75,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::StrNotInHelper::Assertion<char[2],char[2]>
            (&iutest_ar,(StrNotInHelper *)0x31d6c0,"\"a\"","a",(char (*) [2])0x31d74e,actual);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x77,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strstr",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x77,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperSTRLNEQ
            ((char *)iutest_failure_checker.
                     super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                     super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
             (char *)iutest_failure_checker.
                     super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
                     super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (size_t)iutest_failure_checker.
                     super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin,
             (char *)iutest_failure_checker.
                     super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
                     _vptr_ReporterHolder);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x79,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strlen",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x79,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperSTRLNEQ(&iutest_ar,"4","sa",4,val1);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7a,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"strlen",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7a,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0xfaa;
  uVar6 = 0x2a;
  uVar7 = 0;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  expected = this->aa;
  expected_00 = this->aa2;
  expected_01 = this->ab;
  pcVar4 = this->ac;
  iuutil::CmpHelperEqCollections<int*,int*>
            (&iutest_ar,(iuutil *)"aa","aa+(sizeof(aa)/sizeof(aa[0]))","ab",
             "ab+(sizeof(ab)/sizeof(ab[0]))",(char *)expected,expected_00,expected_01,(int *)pcVar4,
             (int *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7c,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch element",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0x1160;
  uVar6 = 0x2a;
  uVar7 = 0;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperEqCollections<int*,int*>
            (&iutest_ar,(iuutil *)0x31ddbb,"ab+(sizeof(ab)/sizeof(ab[0]))","aa",
             "aa+(sizeof(aa)/sizeof(aa[0]))",(char *)expected_01,(int *)pcVar4,expected,expected_00,
             (int *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7d,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch element",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0x12fc;
  uVar6 = 0x2a;
  uVar7 = 0;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperEqCollections<int*,char*>
            (&iutest_ar,(iuutil *)"aa","aa+(sizeof(aa)/sizeof(aa[0]))","ac",
             "ac+(sizeof(ac)/sizeof(ac[0]))",(char *)expected,expected_00,(int *)pcVar4,
             &this->field_0x95,(char *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch in a position",(allocator<char> *)&local_240
            );
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x7e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  uVar5 = 0x149e;
  uVar6 = 0x2a;
  uVar7 = 0;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  actual_00 = expected;
  iuutil::CmpHelperNeCollections<int*,int*>
            (&iutest_ar,(iuutil *)"aa","aa+(sizeof(aa)/sizeof(aa[0]))","aa2",
             "aa2+(sizeof(aa2)/sizeof(aa2[0]))",(char *)expected,expected_00,expected_00,expected_01
             ,(int *)CONCAT44(uVar7,CONCAT22(uVar6,uVar5)));
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x80,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"!=",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x80,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperEqRange<int[5],int[6]>
            (&iutest_ar,(iuutil *)"aa","ab",(char *)expected,(int (*) [5])expected_01,
             (int (*) [6])actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x82,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch element",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x82,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperEqRange<int[6],int[5]>
            (&iutest_ar,(iuutil *)0x31ddbb,"aa",(char *)expected_01,(int (*) [6])expected,
             (int (*) [5])actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x83,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch element",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x83,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperEqRange<int[5],char[5]>
            (&iutest_ar,(iuutil *)"aa","ac",(char *)expected,(int (*) [5])pcVar4,
             (char (*) [5])actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x84,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Mismatch in a position",(allocator<char> *)&local_240
            );
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x84,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperNeRange<int[5],int[5]>
            (&iutest_ar,(iuutil *)"aa","aa2",(char *)expected,(int (*) [5])expected_00,
             (int (*) [5])actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x86,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"!=",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x86,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_4_ = 1;
  iuutil::CmpHelperIsNan<int>(&iutest_ar,"1",&local_1f0[0]._M_first._M_storage);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x88,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Expected: NaN",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x88,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperMatchesRegexEq
            (&iutest_ar,"\"te[0-9]*st\"","\"te0123sta\"","te[0-9]*st","te0123sta");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8b,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Matches Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8b,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperMatchesRegexEq(&iutest_ar,"\"te[0-9]*st\"","null_str","te[0-9]*st",*substr);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8c,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Matches Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperMatchesRegexNe
            (&iutest_ar,"\"te[0-9]*st\"","\"te0123st\"","te[0-9]*st","te0123st");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8d,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Not Matches Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8d,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperContainsRegexEq(&iutest_ar,"\"te[0-9]*st\"","\"a\"","te[0-9]*st","a");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8e,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Contains Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8e,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperContainsRegexEq(&iutest_ar,"\"te[0-9]*st\"","null_str","te[0-9]*st",*substr);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8f,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Contains Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x8f,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperContainsRegexNe
            (&iutest_ar,"\"te[0-9]*st\"","\"te0123sta\"","te[0-9]*st","te0123sta");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x90,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Contains Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x90,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  iuutil::CmpHelperContainsRegexNe
            (&iutest_ar,"\"te[0-9]*st\"","\"te0123st\"","te[0-9]*st","te0123st");
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x91,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Contains Regex (\"te[0-9]*st\")",
             (allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x91,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_8_ = local_1f0[0]._0_8_ & 0xffffffff00000000;
  iutest::internal::CmpHelperEQ<std::variant<int,float,std::__cxx11::string>,int>
            (&iutest_ar,(internal *)"v","0",(char *)&this->v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1f0[0]._M_first,actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x95,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar2 = guard_2;
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)SVar2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Which is: 1",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x95,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_2);
  local_1f0[0]._0_4_ = 0x3dcccccd;
  iutest::internal::CmpHelperEQ<float,std::variant<int,float,std::__cxx11::string>>
            (&iutest_ar,(internal *)"0.1f","v",(char *)local_1f0,(float *)&this->v,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)actual_00);
  if (iutest_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x96,iutest_ar.m_message._M_dataplus._M_p);
    local_240._44_4_ = 2;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_240,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar3 = iutest::TestFlag::GetInstance();
  pTVar3->m_test_flags = (int)guard_2.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0[0]._M_first,"Actual: 1",(allocator<char> *)&local_240);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_1f0[0]._M_first);
  std::__cxx11::string::~string((string *)&local_1f0[0]._M_first);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(local_1f0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x96,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&local_1f0[0]._M_first);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1f0[0]._M_first);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  *count = *count + 1;
  return;
}

Assistant:

void SPITest::FatalFailure2_Sub(int& count)
{
    #define FLAVOR(n) IUTEST_ASSERT##n
    #define FAILURE_MACRO IUTEST_EXPECT_FATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO

    count++;
}